

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O2

void __thiscall
StringEqualNoCaseFailure::StringEqualNoCaseFailure
          (StringEqualNoCaseFailure *this,UtestShell *test,char *fileName,int lineNumber,
          char *expected,char *actual,SimpleString *text)

{
  SimpleString *this_00;
  char cVar1;
  char cVar2;
  SimpleString *expected_00;
  long lVar3;
  SimpleString SStack_48;
  SimpleString local_40;
  SimpleString local_38;
  
  TestFailure::TestFailure(&this->super_TestFailure,test,fileName,lineNumber);
  (this->super_TestFailure)._vptr_TestFailure = (_func_int **)&PTR__TestFailure_001e0d58;
  TestFailure::createUserText((TestFailure *)&SStack_48,(SimpleString *)test);
  this_00 = &(this->super_TestFailure).message_;
  SimpleString::operator=(this_00,&SStack_48);
  SimpleString::~SimpleString(&SStack_48);
  StringFromOrNull((char *)&local_40);
  expected_00 = (SimpleString *)actual;
  StringFromOrNull((char *)&local_38);
  TestFailure::createButWasString((TestFailure *)&SStack_48,expected_00,&local_40);
  SimpleString::operator+=(this_00,&SStack_48);
  SimpleString::~SimpleString(&SStack_48);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_40);
  if (actual != (char *)0x0 && expected != (char *)0x0) {
    lVar3 = 0;
    while( true ) {
      cVar1 = SimpleString::ToLower(actual[lVar3]);
      cVar2 = SimpleString::ToLower(expected[lVar3]);
      if (cVar1 != cVar2) break;
      lVar3 = lVar3 + 1;
    }
    SimpleString::SimpleString(&local_40,actual);
    TestFailure::createDifferenceAtPosString
              ((TestFailure *)&SStack_48,(SimpleString *)actual,(size_t)&local_40,
               (DifferenceFormat)lVar3);
    SimpleString::operator+=(this_00,&SStack_48);
    SimpleString::~SimpleString(&SStack_48);
    SimpleString::~SimpleString(&local_40);
  }
  return;
}

Assistant:

StringEqualNoCaseFailure::StringEqualNoCaseFailure(UtestShell* test, const char* fileName, int lineNumber, const char* expected, const char* actual, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    message_ += createButWasString(StringFromOrNull(expected), StringFromOrNull(actual));
    if((expected) && (actual))
    {
        size_t failStart;
        for (failStart = 0; SimpleString::ToLower(actual[failStart]) == SimpleString::ToLower(expected[failStart]); failStart++)
            ;
        message_ += createDifferenceAtPosString(actual, failStart);
    }
}